

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_plain_member_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,SPIRType *var_type,uint32_t mbr_idx,InterfaceBlockMeta *meta,
          string *mbr_name_qual,string *var_chain_qual,uint32_t *location,uint32_t *var_mbr_idx)

{
  undefined1 auVar1 [8];
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  size_type sVar9;
  SPIRType *pSVar10;
  SPIRConstant *pSVar11;
  undefined8 *puVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  ulong uVar15;
  CompilerMSL *pCVar16;
  char (*ts_2) [2];
  bool local_298;
  bool local_296;
  bool local_295;
  BuiltIn builtin;
  char local_281;
  CompilerMSL *local_280;
  uint local_274;
  SPIRFunction *local_270;
  _Any_data local_268;
  code *local_258;
  code *pcStack_250;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_248;
  string *local_240;
  string qual_var_name;
  string var_chain;
  undefined1 local_1f8 [8];
  CompilerMSL *pCStack_1f0;
  undefined1 local_1e8 [8];
  undefined1 local_1e0 [16];
  SPIRConstant *local_1d0;
  pointer local_1c8;
  undefined1 local_1c0 [304];
  string local_90;
  string mbr_name;
  string local_50;
  
  local_270 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  builtin = BuiltInMax;
  bVar3 = Compiler::is_member_builtin((Compiler *)this,var_type,mbr_idx,&builtin);
  bVar4 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationFlat);
  local_295 = true;
  bVar5 = true;
  if (!bVar4) {
    bVar5 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationFlat);
  }
  bVar4 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationNoPerspective);
  if (!bVar4) {
    local_295 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                           DecorationNoPerspective);
  }
  bVar4 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Centroid);
  local_296 = true;
  local_298 = true;
  if (!bVar4) {
    local_298 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,Centroid);
  }
  local_281 = bVar5;
  bVar4 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                     DecorationSample);
  if (!bVar4) {
    local_296 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationSample);
  }
  local_248 = &ib_type->member_types;
  uVar15 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
           buffer_size;
  local_280 = (CompilerMSL *)var;
  uVar6 = ensure_correct_builtin_type
                    (this,(var_type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                          [mbr_idx].id,builtin);
  (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
  [mbr_idx].id = uVar6;
  local_274 = (uint)local_295;
  if (storage == Input) {
    local_1f8._0_4_ =
         *(undefined4 *)
          &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1f8);
    if (sVar9 == 0) goto LAB_0024e80a;
    uVar7 = build_msl_interpolant_type(this,uVar6,SUB41(local_274,0));
    local_1f8._0_4_ = uVar7;
  }
  else {
LAB_0024e80a:
    local_1f8._0_4_ = uVar6;
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
            (local_248,(TypedID<(spirv_cross::Types)1> *)local_1f8);
  local_240 = &local_50;
  ts_2 = (char (*) [2])(ulong)mbr_idx;
  append_member_name(local_240,this,mbr_name_qual,var_type,mbr_idx);
  pCVar16 = (CompilerMSL *)0x37fc8d;
  ::std::__cxx11::string::string((string *)&local_90,"m",(allocator *)local_1f8);
  ensure_valid_name(&mbr_name,pCVar16,&local_50,&local_90);
  pCVar16 = local_280;
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_50);
  local_240 = &mbr_name;
  uVar7 = (uint32_t)uVar15;
  Compiler::set_member_name
            ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,local_240);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   ib_var_ref,".");
  ::std::operator+(&qual_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &mbr_name);
  ::std::__cxx11::string::~string((string *)local_1f8);
  if (storage == Input) {
    local_1f8._0_4_ =
         *(undefined4 *)
          &(pCVar16->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1f8);
    if (sVar9 != 0) {
      if (local_296 == true && local_298 == false) {
        CompilerGLSL::to_expression_abi_cxx11_
                  (&var_chain,&this->super_CompilerGLSL,this->builtin_sample_id_id,true);
        join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_1f8,(spirv_cross *)".interpolate_at_sample(",
                   (char (*) [24])&var_chain,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
                   ts_2);
        ::std::__cxx11::string::append((string *)&qual_var_name);
        ::std::__cxx11::string::~string((string *)local_1f8);
        ::std::__cxx11::string::~string((string *)&var_chain);
      }
      else {
        ::std::__cxx11::string::append((char *)&qual_var_name);
      }
    }
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   var_chain_qual,".");
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&local_268,&this->super_CompilerGLSL,var_type,mbr_idx);
  ::std::operator+(&var_chain,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268);
  ::std::__cxx11::string::~string((string *)local_268._M_pod_data);
  ::std::__cxx11::string::~string((string *)local_1f8);
  if ((bVar3) && ((meta->strip_array & 1U) == 0)) {
    Compiler::set_member_qualified_name
              ((Compiler *)this,(var_type->super_IVariant).self.id,mbr_idx,&qual_var_name);
    bVar4 = false;
LAB_0024ec58:
    bVar5 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                       DecorationLocation);
    uVar15 = uVar15 & 0xffffffff;
    if (bVar5) {
      uVar8 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                         DecorationLocation);
      *location = uVar8;
      uVar8 = Compiler::get_member_decoration
                        ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,
                         Component);
      if (storage == Input) {
        uVar6 = ensure_correct_input_type(this,uVar6,*location,uVar8,0,meta->strip_array);
        (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        [mbr_idx].id = uVar6;
        local_1f8._0_4_ =
             *(undefined4 *)
              &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
        sVar9 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1f8);
        uVar8 = uVar6;
        if (sVar9 != 0) {
          uVar8 = build_msl_interpolant_type(this,uVar6,SUB41(local_274,0));
        }
        (local_248->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr[uVar15].id =
             uVar8;
      }
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,DecorationLocation
                 ,*location);
      uVar8 = *location;
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
      mark_location_as_used_by_shader(this,uVar8,pSVar10,storage,false);
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
      uVar6 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
      goto LAB_0024ef02;
    }
    bVar5 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)*(uint32_t *)
                            &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
                             super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
                             .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>.
                             _M_head_impl,DecorationLocation);
    if (bVar5) {
      uVar8 = CompilerGLSL::get_accumulated_member_location
                        (&this->super_CompilerGLSL,(SPIRVariable *)local_280,mbr_idx,
                         meta->strip_array);
      *location = uVar8;
      if (storage == Input) {
        uVar6 = ensure_correct_input_type(this,uVar6,uVar8,0,0,meta->strip_array);
        (var_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
        [mbr_idx].id = uVar6;
        local_1f8._0_4_ =
             *(undefined4 *)
              &(local_280->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
        sVar9 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1f8);
        uVar8 = uVar6;
        if (sVar9 != 0) {
          uVar8 = build_msl_interpolant_type(this,uVar6,SUB41(local_274,0));
        }
        (local_248->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>).ptr[uVar15].id =
             uVar8;
      }
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,DecorationLocation
                 ,*location);
      uVar8 = *location;
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
      mark_location_as_used_by_shader(this,uVar8,pSVar10,storage,false);
      pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
      uVar6 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
      goto LAB_0024ef02;
    }
    if (bVar3) {
      bVar5 = Compiler::is_tessellation_shader((Compiler *)this);
      if (bVar5 && storage == Input) {
        local_1f8._0_4_ = builtin;
        sVar13 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->inputs_by_builtin)._M_h,(key_type_conflict *)local_1f8);
        if (sVar13 != 0) {
          local_1f8._0_4_ = builtin;
          pmVar14 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->inputs_by_builtin,(key_type *)local_1f8);
          uVar8 = pmVar14->location;
          *location = uVar8;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,
                     DecorationLocation,uVar8);
          uVar8 = *location;
          pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
          mark_location_as_used_by_shader(this,uVar8,pSVar10,Input,false);
          pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
          uVar6 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
          goto LAB_0024ef02;
        }
      }
      else if ((storage == Output) && (this->capture_output_to_buffer != false)) {
        local_1f8._0_4_ = builtin;
        sVar13 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->outputs_by_builtin)._M_h,(key_type_conflict *)local_1f8);
        if (sVar13 != 0) {
          local_1f8._0_4_ = builtin;
          pmVar14 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->outputs_by_builtin,(key_type *)local_1f8);
          uVar8 = pmVar14->location;
          *location = uVar8;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,
                     DecorationLocation,uVar8);
          uVar8 = *location;
          pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
          mark_location_as_used_by_shader(this,uVar8,pSVar10,Output,false);
          pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
          uVar6 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
          goto LAB_0024ef02;
        }
      }
    }
  }
  else {
    if (((meta->strip_array & 1U) == 0) && (meta->allow_local_declaration == true)) {
      if (storage != Output) {
        if (storage == Input) {
          local_1f8 = (undefined1  [8])this;
          ::std::__cxx11::string::string((string *)&pCStack_1f0,(string *)&var_chain);
          ::std::__cxx11::string::string((string *)&local_1d0,(string *)&qual_var_name);
          local_258 = (code *)0x0;
          pcStack_250 = (code *)0x0;
          local_268._M_unused._M_object = (void *)0x0;
          local_268._8_8_ = 0;
          local_268._M_unused._M_object = operator_new(0x48);
          puVar2 = local_1c8;
          *(undefined1 (*) [8])local_268._M_unused._0_8_ = local_1f8;
          *(code **)((long)local_268._M_unused._0_8_ + 8) =
               (code *)((long)local_268._M_unused._0_8_ + 0x18);
          if (pCStack_1f0 == (CompilerMSL *)local_1e0) {
            *(ulong *)((long)local_268._M_unused._0_8_ + 0x18) =
                 CONCAT71(local_1e0._1_7_,local_1e0[0]);
            *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x20) = local_1e0._8_8_;
          }
          else {
            *(CompilerMSL **)((long)local_268._M_unused._0_8_ + 8) = pCStack_1f0;
            *(ulong *)((long)local_268._M_unused._0_8_ + 0x18) =
                 CONCAT71(local_1e0._1_7_,local_1e0[0]);
          }
          *(undefined1 (*) [8])((long)local_268._M_unused._0_8_ + 0x10) = local_1e8;
          local_1e8 = (undefined1  [8])0x0;
          local_1e0[0] = '\0';
          *(code **)((long)local_268._M_unused._0_8_ + 0x28) =
               (code *)((long)local_268._M_unused._0_8_ + 0x38);
          if (local_1d0 == (SPIRConstant *)local_1c0) {
            *(ulong *)((long)local_268._M_unused._0_8_ + 0x38) =
                 CONCAT71(local_1c0._1_7_,local_1c0[0]);
            *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x40) = local_1c0._8_8_;
          }
          else {
            *(SPIRConstant **)((long)local_268._M_unused._0_8_ + 0x28) = local_1d0;
            *(ulong *)((long)local_268._M_unused._0_8_ + 0x38) =
                 CONCAT71(local_1c0._1_7_,local_1c0[0]);
          }
          local_1c8 = (pointer)0x0;
          *(pointer *)((long)local_268._M_unused._0_8_ + 0x30) = puVar2;
          local_1c0[0] = 0;
          pcStack_250 = ::std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3236:40)>
                        ::_M_invoke;
          local_258 = ::std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3236:40)>
                      ::_M_manager;
          pCStack_1f0 = (CompilerMSL *)local_1e0;
          local_1d0 = (SPIRConstant *)local_1c0;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    (&local_270->fixup_hooks_in,(function<void_()> *)&local_268);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_268);
          add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
          ::$_0::~__0((__0 *)local_1f8);
        }
        goto LAB_0024ec39;
      }
      local_1f8 = (undefined1  [8])this;
      ::std::__cxx11::string::string((string *)&pCStack_1f0,(string *)&qual_var_name);
      ::std::__cxx11::string::string((string *)&local_1d0,(string *)&var_chain);
      local_258 = (code *)0x0;
      pcStack_250 = (code *)0x0;
      local_268._M_unused._M_object = (void *)0x0;
      local_268._8_8_ = 0;
      local_268._M_unused._M_object = operator_new(0x48);
      puVar2 = local_1c8;
      *(undefined1 (*) [8])local_268._M_unused._0_8_ = local_1f8;
      *(code **)((long)local_268._M_unused._0_8_ + 8) =
           (code *)((long)local_268._M_unused._0_8_ + 0x18);
      if (pCStack_1f0 == (CompilerMSL *)local_1e0) {
        *(ulong *)((long)local_268._M_unused._0_8_ + 0x18) = CONCAT71(local_1e0._1_7_,local_1e0[0]);
        *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x20) = local_1e0._8_8_;
      }
      else {
        *(CompilerMSL **)((long)local_268._M_unused._0_8_ + 8) = pCStack_1f0;
        *(ulong *)((long)local_268._M_unused._0_8_ + 0x18) = CONCAT71(local_1e0._1_7_,local_1e0[0]);
      }
      *(undefined1 (*) [8])((long)local_268._M_unused._0_8_ + 0x10) = local_1e8;
      local_1e8 = (undefined1  [8])0x0;
      local_1e0[0] = '\0';
      *(code **)((long)local_268._M_unused._0_8_ + 0x28) =
           (code *)((long)local_268._M_unused._0_8_ + 0x38);
      if (local_1d0 == (SPIRConstant *)local_1c0) {
        *(ulong *)((long)local_268._M_unused._0_8_ + 0x38) = CONCAT71(local_1c0._1_7_,local_1c0[0]);
        *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x40) = local_1c0._8_8_;
      }
      else {
        *(SPIRConstant **)((long)local_268._M_unused._0_8_ + 0x28) = local_1d0;
        *(ulong *)((long)local_268._M_unused._0_8_ + 0x38) = CONCAT71(local_1c0._1_7_,local_1c0[0]);
      }
      local_1c8 = (pointer)0x0;
      *(pointer *)((long)local_268._M_unused._0_8_ + 0x30) = puVar2;
      local_1c0[0] = 0;
      pcStack_250 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3243:41)>
                    ::_M_invoke;
      local_258 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3243:41)>
                  ::_M_manager;
      pCStack_1f0 = (CompilerMSL *)local_1e0;
      local_1d0 = (SPIRConstant *)local_1c0;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&local_270->fixup_hooks_out,(function<void_()> *)&local_268);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_268);
      add_plain_member_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::SPIRType&,unsigned_int,spirv_cross::CompilerMSL::InterfaceBlockMeta&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int&,unsigned_int&)
      ::$_1::~__1((__1 *)local_1f8);
      bVar4 = true;
    }
    else {
LAB_0024ec39:
      bVar4 = false;
    }
    if (*location == 0xffffffff || bVar3) goto LAB_0024ec58;
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,DecorationLocation,
               *location);
    uVar8 = *location;
    pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
    mark_location_as_used_by_shader(this,uVar8,pSVar10,storage,false);
    pSVar10 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar6);
    uVar6 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,pSVar10);
LAB_0024ef02:
    *location = *location + uVar6;
  }
  bVar5 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Component);
  if (bVar5) {
    uVar6 = Compiler::get_member_decoration
                      ((Compiler *)this,(TypeID)(var_type->super_IVariant).self.id,mbr_idx,Component
                      );
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,Component,uVar6);
  }
  if (((bVar3) &&
      (Compiler::set_member_decoration
                 ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,BuiltIn,builtin),
      storage == Output)) && (builtin == BuiltInPosition)) {
    ::std::__cxx11::string::_M_assign((string *)&this->qual_pos_var_name);
  }
  pCVar16 = local_280;
  if (((!bVar4 && *(int *)&(local_280->super_CompilerGLSL).super_Compiler.ir.spirv.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start == 3) &&
      (uVar6 = *(uint32_t *)
                ((long)&(local_280->super_CompilerGLSL).super_Compiler.ir.spirv.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8), uVar6 != 0)) &&
     (pSVar11 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar6),
     pSVar11 != (SPIRConstant *)0x0)) {
    local_270 = (SPIRFunction *)&local_270->fixup_hooks_in;
    if (meta->strip_array == true) {
      local_1f8 = (undefined1  [8])pCVar16;
      local_1e8._0_4_ = mbr_idx;
      pCStack_1f0 = this;
      SPIRType::SPIRType((SPIRType *)local_1e0,ib_type);
      local_258 = (code *)0x0;
      pcStack_250 = (code *)0x0;
      local_268._M_unused._M_object = (void *)0x0;
      local_268._8_8_ = 0;
      puVar12 = (undefined8 *)operator_new(0x168);
      *(undefined4 *)(puVar12 + 2) = local_1e8._0_4_;
      *puVar12 = local_1f8;
      puVar12[1] = pCStack_1f0;
      SPIRType::SPIRType((SPIRType *)(puVar12 + 3),(SPIRType *)local_1e0);
      pcStack_250 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3333:40)>
                    ::_M_invoke;
      local_258 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3333:40)>
                  ::_M_manager;
      local_268._M_unused._M_object = puVar12;
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)local_270,
                 (function<void_()> *)&local_268);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_268);
      SPIRType::~SPIRType((SPIRType *)local_1e0);
    }
    else {
      local_1f8 = (undefined1  [8])this;
      ::std::__cxx11::string::string((string *)&pCStack_1f0,(string *)&qual_var_name);
      local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,mbr_idx);
      local_268._M_unused._M_object = (void *)0x0;
      local_268._8_8_ = 0;
      local_258 = (code *)0x0;
      pcStack_250 = (code *)0x0;
      local_1d0 = pSVar11;
      local_268._M_unused._M_object = operator_new(0x38);
      auVar1 = local_1e8;
      *(undefined1 (*) [8])local_268._M_unused._0_8_ = local_1f8;
      *(code **)((long)local_268._M_unused._0_8_ + 8) =
           (code *)((long)local_268._M_unused._0_8_ + 0x18);
      if (pCStack_1f0 == (CompilerMSL *)local_1e0) {
        *(ulong *)((long)local_268._M_unused._0_8_ + 0x18) = CONCAT71(local_1e0._1_7_,local_1e0[0]);
        *(undefined8 *)((long)local_268._M_unused._0_8_ + 0x20) = local_1e0._8_8_;
      }
      else {
        *(CompilerMSL **)((long)local_268._M_unused._0_8_ + 8) = pCStack_1f0;
        *(ulong *)((long)local_268._M_unused._0_8_ + 0x18) = CONCAT71(local_1e0._1_7_,local_1e0[0]);
      }
      local_1e8 = (undefined1  [8])0x0;
      *(undefined1 (*) [8])((long)local_268._M_unused._0_8_ + 0x10) = auVar1;
      local_1e0[0] = '\0';
      *(uint32_t *)((long)local_268._M_unused._0_8_ + 0x30) = (uint32_t)local_1c8;
      *(SPIRConstant **)((long)local_268._M_unused._0_8_ + 0x28) = local_1d0;
      pcStack_250 = ::std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3347:40)>
                    ::_M_invoke;
      local_258 = ::std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp:3347:40)>
                  ::_M_manager;
      pCStack_1f0 = (CompilerMSL *)local_1e0;
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)local_270,
                 (function<void_()> *)&local_268);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_268);
      ::std::__cxx11::string::~string((string *)&pCStack_1f0);
    }
  }
  if (storage == Input) {
    local_1f8._0_4_ =
         *(undefined4 *)
          &(pCVar16->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
           super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
           .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl;
    sVar9 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->pull_model_inputs)._M_h,(key_type_conflict *)local_1f8);
    if (sVar9 != 0) goto LAB_0024f3ac;
  }
  if (local_281 != '\0') {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,DecorationFlat,0);
  }
  if (local_295 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,
               DecorationNoPerspective,0);
  }
  if (local_298 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,Centroid,0);
  }
  if (local_296 != false) {
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,DecorationSample,0);
  }
LAB_0024f3ac:
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar7,
             SPIRVCrossDecorationInterfaceOrigID,
             *(uint32_t *)
              &(pCVar16->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
               super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
               .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,uVar7,
             SPIRVCrossDecorationInterfaceMemberIndex,*var_mbr_idx);
  ::std::__cxx11::string::~string((string *)&var_chain);
  ::std::__cxx11::string::~string((string *)&qual_var_name);
  ::std::__cxx11::string::~string((string *)&mbr_name);
  return;
}

Assistant:

void CompilerMSL::add_plain_member_variable_to_interface_block(StorageClass storage,
                                                               const string &ib_var_ref, SPIRType &ib_type,
                                                               SPIRVariable &var, SPIRType &var_type,
                                                               uint32_t mbr_idx, InterfaceBlockMeta &meta,
                                                               const string &mbr_name_qual,
                                                               const string &var_chain_qual,
                                                               uint32_t &location, uint32_t &var_mbr_idx)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
	bool is_flat =
	    has_member_decoration(var_type.self, mbr_idx, DecorationFlat) || has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_member_decoration(var_type.self, mbr_idx, DecorationNoPerspective) ||
	                        has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_member_decoration(var_type.self, mbr_idx, DecorationCentroid) ||
	                   has_decoration(var.self, DecorationCentroid);
	bool is_sample =
	    has_member_decoration(var_type.self, mbr_idx, DecorationSample) || has_decoration(var.self, DecorationSample);

	// Add a reference to the member to the interface struct.
	uint32_t mbr_type_id = var_type.member_types[mbr_idx];
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	mbr_type_id = ensure_correct_builtin_type(mbr_type_id, builtin);
	var_type.member_types[mbr_idx] = mbr_type_id;
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(mbr_type_id, is_noperspective));
	else
		ib_type.member_types.push_back(mbr_type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(append_member_name(mbr_name_qual, var_type, mbr_idx), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	bool flatten_stage_out = false;
	string var_chain = var_chain_qual + "." + to_member_name(var_type, mbr_idx);
	if (is_builtin && !meta.strip_array)
	{
		// For the builtin gl_PerVertex, we cannot treat it as a block anyways,
		// so redirect to qualified name.
		set_member_qualified_name(var_type.self, mbr_idx, qual_var_name);
	}
	else if (!meta.strip_array && meta.allow_local_declaration)
	{
		// Unflatten or flatten from [[stage_in]] or [[stage_out]] as appropriate.
		switch (storage)
		{
		case StorageClassInput:
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(var_chain, " = ", qual_var_name, ";");
			});
			break;

		case StorageClassOutput:
			flatten_stage_out = true;
			entry_func.fixup_hooks_out.push_back([=]() {
				statement(qual_var_name, " = ", var_chain, ";");
			});
			break;

		default:
			break;
		}
	}

	// Once we determine the location of the first member within nested structures,
	// from a var of the topmost structure, the remaining flattened members of
	// the nested structures will have consecutive location values. At this point,
	// we've recursively tunnelled into structs, arrays, and matrices, and are
	// down to a single location for each member now.
	if (!is_builtin && location != UINT32_MAX)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (has_member_decoration(var_type.self, mbr_idx, DecorationLocation))
	{
		location = get_member_decoration(var_type.self, mbr_idx, DecorationLocation);
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		if (storage == StorageClassInput)
		{
			mbr_type_id = ensure_correct_input_type(mbr_type_id, location, comp, 0, meta.strip_array);
			var_type.member_types[mbr_idx] = mbr_type_id;
			if (storage == StorageClassInput && pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (has_decoration(var.self, DecorationLocation))
	{
		location = get_accumulated_member_location(var, mbr_idx, meta.strip_array);
		if (storage == StorageClassInput)
		{
			mbr_type_id = ensure_correct_input_type(mbr_type_id, location, 0, 0, meta.strip_array);
			var_type.member_types[mbr_idx] = mbr_type_id;
			if (storage == StorageClassInput && pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(mbr_type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
	{
		location = inputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}
	else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
	{
		location = outputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, location);
		mark_location_as_used_by_shader(location, get<SPIRType>(mbr_type_id), storage);
		location += type_to_location_count(get<SPIRType>(mbr_type_id));
	}

	// Copy the component location, if present.
	if (has_member_decoration(var_type.self, mbr_idx, DecorationComponent))
	{
		uint32_t comp = get_member_decoration(var_type.self, mbr_idx, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	const SPIRConstant *c = nullptr;
	if (!flatten_stage_out && var.storage == StorageClassOutput &&
	    var.initializer != ID(0) && (c = maybe_get<SPIRConstant>(var.initializer)))
	{
		if (meta.strip_array)
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				auto &type = this->get<SPIRType>(var.basetype);
				uint32_t index = get_extended_member_decoration(var.self, mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex);

				auto invocation = to_tesc_invocation_id();
				auto constant_chain = join(to_expression(var.initializer), "[", invocation, "]");
				statement(to_expression(stage_out_ptr_var_id), "[",
				          invocation, "].",
				          to_member_name(ib_type, index), " = ",
				          constant_chain, ".", to_member_name(type, mbr_idx), ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=]() {
				statement(qual_var_name, " = ", constant_expression(
						this->get<SPIRConstant>(c->subconstants[mbr_idx])), ";");
			});
		}
	}

	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceMemberIndex, var_mbr_idx);
}